

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntStateScatter
          (ChLinkMotorLinearDriveline *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,
          double T,bool full_update)

{
  long *plVar1;
  element_type *peVar2;
  undefined7 in_register_00000089;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000089,full_update);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x98))
            (this,uVar3 & 0xffffffff);
  plVar1 = *(long **)&(this->super_ChLinkMotorLinear).field_0x278;
  (**(code **)(*plVar1 + 0xe0))(T,plVar1,off_x,x,off_v,v,uVar3 & 0xffffffff);
  peVar2 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1c])
            (T,peVar2,(ulong)(off_x + 1),x,(ulong)(off_v + 1),v,uVar3 & 0xffffffff);
  peVar2 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1c])
            (T,peVar2,(ulong)(off_x + 2),x,(ulong)(off_v + 2),v,uVar3 & 0xffffffff);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x98))
            (T,this,uVar3 & 0xffffffff);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntStateScatter(const unsigned int off_x,
                                                 const ChState& x,
                                                 const unsigned int off_v,
                                                 const ChStateDelta& v,
                                                 const double T,
                                                 bool full_update) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntStateScatter(off_x, x, off_v, v, T, full_update);

    innershaft1lin->IntStateScatter(off_x + 0, x, off_v + 0, v, T, full_update);
    innershaft2lin->IntStateScatter(off_x + 1, x, off_v + 1, v, T, full_update);
    innershaft2rot->IntStateScatter(off_x + 2, x, off_v + 2, v, T, full_update);

    Update(T, full_update);
}